

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,string *emsg,bool *changed)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  StringEntry *pSVar5;
  ulong uVar6;
  string *psVar7;
  size_type sVar8;
  ostream *poVar9;
  long lVar10;
  long *plVar11;
  cmSystemToolsRPathInfo *local_640;
  cmSystemToolsRPathInfo *local_568;
  ulong local_560;
  unsigned_long j;
  __mbstate_t local_550;
  int local_544;
  undefined1 auStack_540 [4];
  int i_1;
  ofstream f;
  string local_320 [32];
  string local_300 [32];
  undefined1 local_2e0 [8];
  ostringstream e;
  size_type pos;
  int i;
  StringEntry *se_runpath;
  StringEntry *se_rpath;
  char *se_name [2];
  StringEntry *se [2];
  uint local_120;
  int se_count;
  undefined1 local_110 [8];
  cmELF elf;
  cmSystemToolsRPathInfo rp [2];
  int local_3c;
  int rp_count;
  bool *changed_local;
  string *emsg_local;
  string *newRPath_local;
  string *oldRPath_local;
  string *file_local;
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  local_3c = 0;
  local_568 = (cmSystemToolsRPathInfo *)((long)&elf.ErrorMessage.field_2 + 8);
  do {
    cmSystemToolsRPathInfo::cmSystemToolsRPathInfo(local_568);
    local_568 = local_568 + 1;
  } while (local_568 != (cmSystemToolsRPathInfo *)((long)&rp[1].Value.field_2 + 8));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmELF::cmELF((cmELF *)local_110,pcVar4);
  se_name[1] = (char *)0x0;
  se_name[0] = (char *)0x0;
  pSVar5 = cmELF::GetRPath((cmELF *)local_110);
  if (pSVar5 != (StringEntry *)0x0) {
    se_name[1] = (char *)pSVar5;
  }
  local_120 = (uint)(pSVar5 != (StringEntry *)0x0);
  pSVar5 = cmELF::GetRunPath((cmELF *)local_110);
  if (pSVar5 != (StringEntry *)0x0) {
    se_name[(long)(int)local_120 + 1] = (char *)pSVar5;
    se_name[(long)(int)local_120 + -1] = "RUNPATH";
    local_120 = local_120 + 1;
  }
  if (local_120 == 0) {
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      if (emsg != (string *)0x0) {
        std::__cxx11::string::operator=
                  ((string *)emsg,"No valid ELF RPATH or RUNPATH entry exists in the file; ");
        psVar7 = cmELF::GetErrorMessage_abi_cxx11_((cmELF *)local_110);
        std::__cxx11::string::operator+=((string *)emsg,(string *)psVar7);
      }
      file_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
      file_local._7_1_ = 1;
      bVar1 = true;
    }
  }
  else {
    for (pos._0_4_ = 0; (int)pos < (int)local_120; pos._0_4_ = (int)pos + 1) {
      if ((local_3c == 0) ||
         (elf.ErrorMessage.field_2._8_8_ != *(long *)(se_name[(long)(int)pos + 1] + 0x20))) {
        sVar8 = cmSystemToolsFindRPath((string *)se_name[(long)(int)pos + 1],oldRPath);
        if (sVar8 == 0xffffffffffffffff) {
          sVar8 = cmSystemToolsFindRPath((string *)se_name[(long)(int)pos + 1],newRPath);
          if (sVar8 == 0xffffffffffffffff) {
            if (emsg != (string *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e0);
              poVar9 = std::operator<<((ostream *)local_2e0,"The current ");
              poVar9 = std::operator<<(poVar9,se_name[(long)(int)pos + -1]);
              poVar9 = std::operator<<(poVar9," is:\n");
              poVar9 = std::operator<<(poVar9,"  ");
              poVar9 = std::operator<<(poVar9,(string *)se_name[(long)(int)pos + 1]);
              poVar9 = std::operator<<(poVar9,"\n");
              poVar9 = std::operator<<(poVar9,"which does not contain:\n");
              poVar9 = std::operator<<(poVar9,"  ");
              poVar9 = std::operator<<(poVar9,(string *)oldRPath);
              poVar9 = std::operator<<(poVar9,"\n");
              std::operator<<(poVar9,"as was expected.");
              std::__cxx11::ostringstream::str();
              std::__cxx11::string::operator=((string *)emsg,local_300);
              std::__cxx11::string::~string(local_300);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e0);
            }
            file_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_0015e4c0;
          }
        }
        else {
          *(undefined8 *)((long)&rp[(long)local_3c + -1].Value.field_2 + 8) =
               *(undefined8 *)(se_name[(long)(int)pos + 1] + 0x20);
          rp[local_3c].Position = *(unsigned_long *)(se_name[(long)(int)pos + 1] + 0x28);
          std::__cxx11::string::operator=((string *)&rp[local_3c].Size,se_name[(long)(int)pos + -1])
          ;
          std::__cxx11::string::substr((ulong)local_320,(ulong)se_name[(long)(int)pos + 1]);
          std::__cxx11::string::operator=
                    ((string *)(rp[local_3c].Name.field_2._M_local_buf + 8),local_320);
          std::__cxx11::string::~string(local_320);
          std::__cxx11::string::operator+=
                    ((string *)(rp[local_3c].Name.field_2._M_local_buf + 8),(string *)newRPath);
          pcVar4 = se_name[(long)(int)pos + 1];
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)&f.field_0x1f8,(ulong)pcVar4);
          std::__cxx11::string::operator+=
                    ((string *)(rp[local_3c].Name.field_2._M_local_buf + 8),(string *)&f.field_0x1f8
                    );
          std::__cxx11::string::~string((string *)&f.field_0x1f8);
          uVar6 = rp[local_3c].Position;
          lVar10 = std::__cxx11::string::length();
          if (uVar6 < lVar10 + 1U) {
            if (emsg != (string *)0x0) {
              std::__cxx11::string::operator=
                        ((string *)emsg,"The replacement path is too long for the ");
              std::__cxx11::string::operator+=((string *)emsg,se_name[(long)(int)pos + -1]);
              std::__cxx11::string::operator+=((string *)emsg," entry.");
            }
            file_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_0015e4c0;
          }
          local_3c = local_3c + 1;
        }
      }
    }
    bVar1 = false;
  }
LAB_0015e4c0:
  cmELF::~cmELF((cmELF *)local_110);
  if (!bVar1) {
    if (local_3c == 0) {
      file_local._7_1_ = 1;
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      _Var3 = std::operator|(_S_in,_S_out);
      _Var3 = std::operator|(_Var3,_S_bin);
      std::ofstream::ofstream(auStack_540,pcVar4,_Var3);
      bVar2 = std::ios::operator!((ios *)(auStack_540 + (long)_auStack_540[-3]));
      if ((bVar2 & 1) == 0) {
        for (local_544 = 0; local_544 < local_3c; local_544 = local_544 + 1) {
          std::fpos<__mbstate_t>::fpos
                    ((fpos<__mbstate_t> *)&j,
                     *(streamoff *)((long)&rp[(long)local_544 + -1].Value.field_2 + 8));
          plVar11 = (long *)std::ostream::seekp(auStack_540,j,local_550);
          bVar2 = std::ios::operator!((ios *)((long)plVar11 + *(long *)(*plVar11 + -0x18)));
          if ((bVar2 & 1) != 0) {
            if (emsg != (string *)0x0) {
              std::__cxx11::string::operator=((string *)emsg,"Error seeking to ");
              std::__cxx11::string::operator+=((string *)emsg,(string *)&rp[local_544].Size);
              std::__cxx11::string::operator+=((string *)emsg," position.");
            }
            file_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_0015e807;
          }
          std::operator<<((ostream *)auStack_540,
                          (string *)(rp[local_544].Name.field_2._M_local_buf + 8));
          for (local_560 = std::__cxx11::string::length(); local_560 < rp[local_544].Position;
              local_560 = local_560 + 1) {
            std::operator<<((ostream *)auStack_540,'\0');
          }
          bVar2 = std::ios::operator!((ios *)(auStack_540 + (long)_auStack_540[-3]));
          if ((bVar2 & 1) != 0) {
            if (emsg != (string *)0x0) {
              std::__cxx11::string::operator=((string *)emsg,"Error writing the new ");
              std::__cxx11::string::operator+=((string *)emsg,(string *)&rp[local_544].Size);
              std::__cxx11::string::operator+=((string *)emsg," string to the file.");
            }
            file_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_0015e807;
          }
        }
        bVar1 = false;
      }
      else {
        if (emsg != (string *)0x0) {
          std::__cxx11::string::operator=((string *)emsg,"Error opening file for update.");
        }
        file_local._7_1_ = 0;
        bVar1 = true;
      }
LAB_0015e807:
      std::ofstream::~ofstream(auStack_540);
      if (!bVar1) {
        if (changed != (bool *)0x0) {
          *changed = true;
        }
        file_local._7_1_ = 1;
      }
    }
  }
  local_640 = (cmSystemToolsRPathInfo *)((long)&rp[1].Value.field_2 + 8);
  do {
    local_640 = local_640 + -1;
    cmSystemToolsRPathInfo::~cmSystemToolsRPathInfo(local_640);
  } while (local_640 != (cmSystemToolsRPathInfo *)((long)&elf.ErrorMessage.field_2 + 8));
  return (bool)(file_local._7_1_ & 1);
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath,
                                std::string* emsg,
                                bool* changed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if(changed)
    {
    *changed = false;
    }
  int rp_count = 0;
  cmSystemToolsRPathInfo rp[2];
  {
  // Parse the ELF binary.
  cmELF elf(file.c_str());

  // Get the RPATH and RUNPATH entries from it.
  int se_count = 0;
  cmELF::StringEntry const* se[2] = {0, 0};
  const char* se_name[2] = {0, 0};
  if(cmELF::StringEntry const* se_rpath = elf.GetRPath())
    {
    se[se_count] = se_rpath;
    se_name[se_count] = "RPATH";
    ++se_count;
    }
  if(cmELF::StringEntry const* se_runpath = elf.GetRunPath())
    {
    se[se_count] = se_runpath;
    se_name[se_count] = "RUNPATH";
    ++se_count;
    }
  if(se_count == 0)
    {
    if(newRPath.empty())
      {
      // The new rpath is empty and there is no rpath anyway so it is
      // okay.
      return true;
      }
    else
      {
      if(emsg)
        {
        *emsg = "No valid ELF RPATH or RUNPATH entry exists in the file; ";
        *emsg += elf.GetErrorMessage();
        }
      return false;
      }
    }

  for(int i=0; i < se_count; ++i)
    {
    // If both RPATH and RUNPATH refer to the same string literal it
    // needs to be changed only once.
    if(rp_count && rp[0].Position == se[i]->Position)
      {
      continue;
      }

    // Make sure the current rpath contains the old rpath.
    std::string::size_type pos =
      cmSystemToolsFindRPath(se[i]->Value, oldRPath);
    if(pos == std::string::npos)
      {
      // If it contains the new rpath instead then it is okay.
      if(cmSystemToolsFindRPath(se[i]->Value, newRPath) != std::string::npos)
        {
        continue;
        }
      if(emsg)
        {
        std::ostringstream e;
        e << "The current " << se_name[i] << " is:\n"
          << "  " << se[i]->Value << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
        *emsg = e.str();
        }
      return false;
      }

    // Store information about the entry in the file.
    rp[rp_count].Position = se[i]->Position;
    rp[rp_count].Size = se[i]->Size;
    rp[rp_count].Name = se_name[i];

    // Construct the new value which preserves the part of the path
    // not being changed.
    rp[rp_count].Value = se[i]->Value.substr(0, pos);
    rp[rp_count].Value += newRPath;
    rp[rp_count].Value += se[i]->Value.substr(pos+oldRPath.length(),
                                              oldRPath.npos);

    // Make sure there is enough room to store the new rpath and at
    // least one null terminator.
    if(rp[rp_count].Size < rp[rp_count].Value.length()+1)
      {
      if(emsg)
        {
        *emsg = "The replacement path is too long for the ";
        *emsg += se_name[i];
        *emsg += " entry.";
        }
      return false;
      }

    // This entry is ready for update.
    ++rp_count;
    }
  }

  // If no runtime path needs to be changed, we are done.
  if(rp_count == 0)
    {
    return true;
    }

  {
  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                  std::ios::in | std::ios::out | std::ios::binary);
  if(!f)
    {
    if(emsg)
      {
      *emsg = "Error opening file for update.";
      }
    return false;
    }

  // Store the new RPATH and RUNPATH strings.
  for(int i=0; i < rp_count; ++i)
    {
    // Seek to the RPATH position.
    if(!f.seekp(rp[i].Position))
      {
      if(emsg)
        {
        *emsg = "Error seeking to ";
        *emsg += rp[i].Name;
        *emsg += " position.";
        }
      return false;
      }

    // Write the new rpath.  Follow it with enough null terminators to
    // fill the string table entry.
    f << rp[i].Value;
    for(unsigned long j=rp[i].Value.length(); j < rp[i].Size; ++j)
      {
      f << '\0';
      }

    // Make sure it wrote correctly.
    if(!f)
      {
      if(emsg)
        {
        *emsg = "Error writing the new ";
        *emsg += rp[i].Name;
        *emsg += " string to the file.";
        }
      return false;
      }
    }
  }

  // Everything was updated successfully.
  if(changed)
    {
    *changed = true;
    }
  return true;
#else
  (void)file;
  (void)oldRPath;
  (void)newRPath;
  (void)emsg;
  (void)changed;
  return false;
#endif
}